

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip.c
# Opt level: O0

void verify_info_zip_ux(archive *a,int seek_checks)

{
  int in_ESI;
  archive_entry *in_RDI;
  char *buff [128];
  archive_entry *ae;
  archive_entry **in_stack_fffffffffffffbc8;
  archive_entry *entry;
  archive_entry **entry_00;
  int n;
  archive *in_stack_fffffffffffffbd0;
  uint uVar1;
  char *e2;
  archive *a_00;
  archive *in_stack_fffffffffffffbd8;
  longlong v1;
  undefined4 in_stack_fffffffffffffbe0;
  wchar_t in_stack_fffffffffffffbe4;
  char *in_stack_fffffffffffffbe8;
  wchar_t in_stack_fffffffffffffbf4;
  char *in_stack_fffffffffffffbf8;
  void *in_stack_fffffffffffffc00;
  archive *in_stack_fffffffffffffc08;
  char *in_stack_fffffffffffffc10;
  wchar_t in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  char *in_stack_fffffffffffffc20;
  void *in_stack_fffffffffffffc28;
  wchar_t in_stack_fffffffffffffc34;
  char *in_stack_fffffffffffffc38;
  size_t in_stack_fffffffffffffc50;
  char *in_stack_fffffffffffffc58;
  void *in_stack_fffffffffffffc60;
  archive_entry *local_18;
  
  archive_read_next_header(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  entry = in_RDI;
  assertion_equal_int(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      (longlong)in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,
                      (longlong)in_RDI,(char *)0x1ba1fd,in_stack_fffffffffffffc00);
  uVar1 = (uint)((ulong)in_stack_fffffffffffffbd0 >> 0x20);
  archive_entry_pathname(entry);
  e2 = (char *)((ulong)uVar1 << 0x20);
  assertion_equal_string
            (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4,in_stack_fffffffffffffbe8,
             (char *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
             (char *)in_stack_fffffffffffffbd8,e2,in_stack_fffffffffffffc10,
             in_stack_fffffffffffffc18);
  archive_entry_mtime(local_18);
  assertion_equal_int(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      (longlong)in_stack_fffffffffffffbd8,e2,0,(char *)0x1ba285,
                      in_stack_fffffffffffffc00);
  archive_entry_size(local_18);
  assertion_equal_int(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      (longlong)in_stack_fffffffffffffbd8,e2,0,(char *)0x1ba2c3,
                      in_stack_fffffffffffffc00);
  archive_entry_is_encrypted(local_18);
  assertion_equal_int(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      (longlong)in_stack_fffffffffffffbd8,e2,0,(char *)0x1ba2ff,
                      in_stack_fffffffffffffc00);
  archive_read_has_encrypted_entries(in_stack_fffffffffffffbd8);
  assertion_equal_int(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      (longlong)in_stack_fffffffffffffbd8,e2,(longlong)in_RDI,(char *)0x1ba33d,
                      in_stack_fffffffffffffc00);
  if (in_ESI != 0) {
    archive_entry_mode(local_18);
    assertion_equal_int(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                        (longlong)in_stack_fffffffffffffbd8,e2,0,(char *)0x1ba387,
                        in_stack_fffffffffffffc00);
  }
  failure("zip reader should read Info-ZIP New Unix Extra Field");
  archive_entry_uid(local_18);
  assertion_equal_int(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      (longlong)in_stack_fffffffffffffbd8,e2,0,(char *)0x1ba3d3,
                      in_stack_fffffffffffffc00);
  archive_entry_gid(local_18);
  assertion_equal_int(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      (longlong)in_stack_fffffffffffffbd8,e2,0,(char *)0x1ba411,
                      in_stack_fffffffffffffc00);
  failure("archive_read_data() returns number of bytes read");
  archive_read_data(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                    (size_t)in_stack_fffffffffffffbf8);
  assertion_equal_int(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      (longlong)in_stack_fffffffffffffbd8,e2,0,(char *)0x1ba467,
                      in_stack_fffffffffffffc00);
  entry_00 = (archive_entry **)0x12;
  a_00 = (archive *)0x2e6398;
  v1 = 0;
  assertion_equal_mem(in_stack_fffffffffffffc38,in_stack_fffffffffffffc34,in_stack_fffffffffffffc28,
                      in_stack_fffffffffffffc20,
                      (void *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                      in_stack_fffffffffffffc10,in_stack_fffffffffffffc50,in_stack_fffffffffffffc58,
                      in_stack_fffffffffffffc60);
  archive_read_next_header(a_00,entry_00);
  assertion_equal_int(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,v1,(char *)a_00,
                      (longlong)in_RDI,(char *)0x1ba4fa,in_stack_fffffffffffffc00);
  failure("the archive file has just one file");
  archive_file_count((archive *)in_RDI);
  n = 0;
  assertion_equal_int(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,v1,(char *)a_00,0,
                      (char *)0x1ba546,in_stack_fffffffffffffc00);
  archive_filter_code(a_00,n);
  assertion_equal_int(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,v1,(char *)a_00,
                      (longlong)in_RDI,(char *)0x1ba587,in_stack_fffffffffffffc00);
  archive_format((archive *)in_RDI);
  assertion_equal_int(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,v1,(char *)a_00,
                      (longlong)in_RDI,(char *)0x1ba5c7,in_stack_fffffffffffffc00);
  archive_read_close((archive *)0x1ba5d4);
  assertion_equal_int(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,v1,(char *)a_00,
                      (longlong)in_RDI,(char *)0x1ba606,in_stack_fffffffffffffc00);
  archive_read_free((archive *)0x1ba613);
  assertion_equal_int(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,v1,(char *)a_00,0,
                      (char *)0x1ba641,in_stack_fffffffffffffc00);
  return;
}

Assistant:

static void
verify_info_zip_ux(struct archive *a, int seek_checks)
{
	struct archive_entry *ae;
	char *buff[128];

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("file1", archive_entry_pathname(ae));
	assertEqualInt(1300668680, archive_entry_mtime(ae));
	assertEqualInt(18, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
	if (seek_checks)
		assertEqualInt(AE_IFREG | 0644, archive_entry_mode(ae));
	failure("zip reader should read Info-ZIP New Unix Extra Field");
	assertEqualInt(1001, archive_entry_uid(ae));
	assertEqualInt(1001, archive_entry_gid(ae));
	if (libz_enabled) {
		failure("archive_read_data() returns number of bytes read");
		assertEqualInt(18, archive_read_data(a, buff, 19));
		assertEqualMem(buff, "hello\nhello\nhello\n", 18);
	} else {
		assertEqualInt(ARCHIVE_FAILED, archive_read_data(a, buff, 19));
		assertEqualString(archive_error_string(a),
		    "Unsupported ZIP compression method (deflation)");
		assert(archive_errno(a) != 0);
	}
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify the number of files read. */
	failure("the archive file has just one file");
	assertEqualInt(1, archive_file_count(a));

	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_ZIP, archive_format(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}